

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::x86::
     interrupt<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (int index,Context *context)

{
  uint16_t uVar1;
  uint16_t uVar2;
  Registers *pRVar3;
  Segments *pSVar4;
  uint16_t flags;
  uint16_t local_1a;
  
  uVar1 = *(uint16_t *)((context->memory).memory._M_elems + (uint)(index << 2));
  uVar2 = *(uint16_t *)((context->memory).memory._M_elems + (ulong)(uint)(index << 2) + 2);
  local_1a = Flags::get(&context->flags);
  Primitive::
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (&local_1a,context);
  Flags::set_from<unsigned_int,(InstructionSet::x86::Flag)5,(InstructionSet::x86::Flag)4>
            (&context->flags,0);
  Primitive::
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (&(context->registers).cs_,context);
  Primitive::
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (&(context->registers).ip_,context);
  pRVar3 = (context->flow_controller).registers_;
  pRVar3->cs_ = uVar2;
  pSVar4 = (context->flow_controller).segments_;
  pSVar4->cs_base_ = (uint)pSVar4->registers_->cs_ << 4;
  pRVar3->ip_ = uVar1;
  return;
}

Assistant:

void interrupt(
	int index,
	ContextT &context
) {
	const uint32_t address = static_cast<uint32_t>(index) << 2;
	context.memory.preauthorise_read(address, sizeof(uint16_t) * 2);
	context.memory.preauthorise_stack_write(sizeof(uint16_t) * 3);

	const uint16_t ip = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(address);
	const uint16_t cs = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(address + 2);

	auto flags = context.flags.get();
	Primitive::push<uint16_t, true>(flags, context);
	context.flags.template set_from<Flag::Interrupt, Flag::Trap>(0);

	// Push CS and IP.
	Primitive::push<uint16_t, true>(context.registers.cs(), context);
	Primitive::push<uint16_t, true>(context.registers.ip(), context);

	// Set new destination.
	context.flow_controller.jump(cs, ip);
}